

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O3

void printitem(Item *q)

{
  short sVar1;
  short *psVar2;
  long lVar3;
  
  while( true ) {
    sVar1 = ((Symbol *)q)->type;
    if (sVar1 != 2) break;
    q = (Item *)((anon_union_8_4_46e41722_for_element *)&((Symbol *)q)->subtype)->sym;
  }
  if (sVar1 != 0x102) {
    if (sVar1 == 1) {
      psVar2 = (short *)((Symbol *)q)->subtype;
      if (*psVar2 == 1) {
        lVar3 = *(long *)(psVar2 + 4);
        if (lVar3 == 4) {
          newline = 1;
          indent = indent + -1;
        }
        else if (lVar3 == 2) {
          newline = 1;
          indent = indent + 1;
        }
        else if (lVar3 == 1) {
          newline = 1;
        }
      }
      lVar3 = *(long *)(psVar2 + 0x24);
    }
    else {
      lVar3 = ((Symbol *)q)->subtype;
    }
    fprintf((FILE *)fcout," %s",lVar3);
    return;
  }
  fputs((char *)((Symbol *)q)->subtype,(FILE *)fcout);
  return;
}

Assistant:

void printitem(q) Item* q; {
		if (q->itemtype == SYMBOL) {
			if (SYM(q)->type == SPECIAL) {
				switch (SYM(q)->subtype) {

				case SEMI:
					newline = 1;
					break;
				case BEGINBLK:
					newline = 1;
					indent++;
					break;
				case ENDBLK:
					newline = 1;
					indent--;
					break;
				}
			}
			Fprintf(fcout, " %s", SYM(q)->name);
		} else if (q->itemtype == VERBATIM) {
			Fprintf(fcout, "%s", STR(q));
		} else if (q->itemtype == ITEM) {
			printitem(ITM(q));
		}else {
			Fprintf(fcout, " %s", STR(q));
		}
}